

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O3

void __thiscall
icu_63::DecimalFormatSymbols::DecimalFormatSymbols
          (DecimalFormatSymbols *this,DecimalFormatSymbols *source)

{
  long lVar1;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__DecimalFormatSymbols_003e6820;
  lVar1 = 0x10;
  do {
    *(undefined ***)((long)this + lVar1 + -8) = &PTR__UnicodeString_003f5be0;
    *(undefined2 *)((long)&(this->super_UObject)._vptr_UObject + lVar1) = 2;
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0x710);
  (this->fNoSymbol).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003f5be0;
  (this->fNoSymbol).fUnion.fStackFields.fLengthAndFlags = 2;
  Locale::Locale(&this->locale);
  lVar1 = 0x980;
  do {
    *(undefined ***)((long)this + lVar1 + -8) = &PTR__UnicodeString_003f5be0;
    *(undefined2 *)((long)&(this->super_UObject)._vptr_UObject + lVar1) = 2;
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0xa40);
  lVar1 = 0xa40;
  do {
    *(undefined ***)((long)this + lVar1 + -8) = &PTR__UnicodeString_003f5be0;
    *(undefined2 *)((long)&(this->super_UObject)._vptr_UObject + lVar1) = 2;
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0xb00);
  operator=(this,source);
  return;
}

Assistant:

DecimalFormatSymbols::DecimalFormatSymbols(const DecimalFormatSymbols &source)
    : UObject(source)
{
    *this = source;
}